

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiener.cxx
# Opt level: O0

void __thiscall Wiener::Wiener(Wiener *this,Time *time,string *name,string *type)

{
  double dVar1;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_59;
  string local_58;
  string *local_28;
  string *type_local;
  string *name_local;
  Time *time_local;
  Wiener *this_local;
  
  local_28 = type;
  type_local = name;
  name_local = (string *)time;
  time_local = (Time *)this;
  RandN::RandN(&this->super_RandN);
  StochasticVariable::StochasticVariable
            ((StochasticVariable *)this,(Time *)name_local,type_local,local_28);
  *(undefined ***)this = &PTR__Wiener_00191790;
  *(undefined ***)&this->field_0x60 = &PTR__Wiener_00191850;
  *(undefined ***)&this->field_0x78 = &PTR__Wiener_00191898;
  this->wienerMean = 0.0;
  this->wienerStdDev = 1.0;
  dVar1 = sqrt(*(double *)(*(long *)&this->field_0x70 + 200));
  this->wienerSqrtDt = dVar1;
  std::__cxx11::string::operator=((string *)&this->field_0x128,"Wiener process");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"mean",&local_59);
  Parametric::addParameter((Parametric *)this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"variance",&local_81);
  Parametric::addParameter((Parametric *)this,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  (**(code **)(*(long *)this + 0x68))();
  return;
}

Assistant:

Wiener::Wiener(Time *time, const string& name, const string& type)
	: StochasticVariable( time, name, type )
{
	wienerMean = 0.0;
	wienerStdDev = 1.0;
	wienerSqrtDt = sqrt(xTime->dt);
	stochDescription = "Wiener process";
	addParameter("mean");
	addParameter("variance");
	init();
}